

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void check_all_nodes_registered(EVmaster master)

{
  __time_t *p_Var1;
  undefined8 *puVar2;
  anon_union_16_6_9efb12f0_for_u *paVar3;
  uint uVar4;
  int iVar5;
  EVint_node_list p_Var6;
  EVdfg_configuration p_Var7;
  _EVdfg_config_action *p_Var8;
  __time_t _Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  anon_struct_8_2_24f754fc_for_period list;
  EVdfg_config_action act;
  EVdfg_config_action act_00;
  EVdfg_config_action act_01;
  EVdfg_config_action act_02;
  EVdfg_config_action act_03;
  EVdfg_config_action act_04;
  int iVar12;
  int iVar13;
  __pid_t _Var14;
  ulong uVar15;
  EVdfg_stone_state p_Var16;
  EVmaster p_Var17;
  EVdfg_configuration p_Var18;
  EVdfg_stone_state *pp_Var19;
  int *piVar20;
  char *pcVar21;
  char **ppcVar22;
  CMFormat format;
  pthread_t pVar23;
  FILE *pFVar24;
  EVdfg_stone_state extraout_RDX;
  long lVar25;
  EVdfg dfg;
  long lVar26;
  FILE *out;
  CMConnection p_Var27;
  EVdfg_stone_state p_Var28;
  attr_list in_R8;
  ulong uVar29;
  int i_2;
  long lVar30;
  EVmaster p_Var31;
  int i;
  long lVar32;
  long lVar33;
  long lVar34;
  CManager p_Var35;
  byte bVar36;
  EVready_msg msg;
  EVstone EStack_e4;
  int iStack_e0;
  int local_d8;
  EVstone EStack_d4;
  timespec ts;
  anon_union_40_5_866f0a8f_for_u local_a8;
  undefined1 local_70 [24];
  EVmaster local_58;
  CManager local_50;
  CMFormat local_48;
  long local_40;
  EVmaster local_38;
  
  bVar36 = 0;
  if (master->node_join_handler == (EVmasterJoinHandlerFunc)0x0) {
    dfg = master->dfg;
    uVar15 = 0;
    uVar29 = (ulong)(uint)master->node_count;
    if (master->node_count < 1) {
      uVar29 = uVar15;
    }
    for (; uVar29 * 0x38 - uVar15 != 0; uVar15 = uVar15 + 0x38) {
      if ((*(int *)((long)&master->nodes->self + uVar15) == 0) &&
         (*(long *)((long)&master->nodes->conn + uVar15) == 0)) {
        return;
      }
    }
  }
  else {
    p_Var6 = master->nodes;
    iVar12 = master->node_count;
    IntCManager_unlock(master->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                       ,0xb35);
    (*master->node_join_handler)(master,p_Var6[(long)iVar12 + -1].name,(void *)0x0,(void *)0x0);
    IntCManager_lock(master->cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0xb37);
    dfg = master->dfg;
    if (dfg == (EVdfg)0x0) {
      return;
    }
    if (dfg->realized == 0) {
      return;
    }
    if ((dfg->realized == 1) && (master->reconfig == 1)) {
      return;
    }
  }
  local_58 = master;
  if (master->no_deployment != 0) goto LAB_001459a7;
  p_Var17 = dfg->master;
  if (p_Var17->sig_reconfig_bool == 0) {
    if (p_Var17->state != DFG_Joining) {
      __assert_fail("master->state == DFG_Joining",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                    ,0x9f1,"void perform_deployment(EVdfg)");
    }
    p_Var17->state = DFG_Starting;
    iVar12 = CMtrace_val[0xd];
    if (p_Var17->cm->CMTrace_file == (FILE *)0x0) {
      iVar12 = CMtrace_init(p_Var17->cm,EVdfgVerbose);
    }
    if (iVar12 != 0) {
      if (CMtrace_PID != 0) {
        pFVar24 = (FILE *)p_Var17->cm->CMTrace_file;
        _Var14 = getpid();
        pVar23 = pthread_self();
        fprintf(pFVar24,"P%lxT%lx - ",(long)_Var14,pVar23);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)p_Var17->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)p_Var17->cm->CMTrace_file,
              "EVDFG check all nodes registered -  master DFG state is %s\n",
              str_state[p_Var17->state]);
    }
    fflush((FILE *)p_Var17->cm->CMTrace_file);
    add_bridge_stones(dfg,dfg->working_state);
    dfg->deploy_ack_count = 0;
    if (dfg->deploy_ack_condition == -1) {
      iVar12 = INT_CMCondition_get(p_Var17->cm,(CMConnection)0x0);
      dfg->deploy_ack_condition = iVar12;
    }
    p_Var17 = dfg->master;
    lVar26 = 0x30;
    for (lVar32 = 0; iVar12 = p_Var17->node_count, lVar32 < iVar12; lVar32 = lVar32 + 1) {
      deploy_to_node(dfg,(int)lVar32,dfg->working_state);
      p_Var17 = dfg->master;
      *(undefined4 *)((long)&p_Var17->nodes->name + lVar26) = 1;
      lVar26 = lVar26 + 0x38;
    }
  }
  else {
    iVar12 = CMtrace_val[0xd];
    if (p_Var17->cm->CMTrace_file == (FILE *)0x0) {
      iVar12 = CMtrace_init(p_Var17->cm,EVdfgVerbose);
    }
    if (iVar12 != 0) {
      if (CMtrace_PID != 0) {
        pFVar24 = (FILE *)p_Var17->cm->CMTrace_file;
        _Var14 = getpid();
        pVar23 = pthread_self();
        fprintf(pFVar24,"P%lxT%lx - ",(long)_Var14,pVar23);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)p_Var17->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)p_Var17->cm->CMTrace_file,
              "EVDFG perform_deployment -  master DFG state set to %s\n",str_state[p_Var17->state]);
    }
    fflush((FILE *)p_Var17->cm->CMTrace_file);
    if (p_Var17->state != DFG_Reconfiguring) {
      __assert_fail("master->state == DFG_Reconfiguring",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                    ,0x9ff,"void perform_deployment(EVdfg)");
    }
    p_Var31 = dfg->master;
    p_Var7 = dfg->working_state;
    lVar26 = 0;
    for (lVar32 = 0; lVar32 < p_Var7->pending_action_count; lVar32 = lVar32 + 1) {
      p_Var1 = (__time_t *)((long)&p_Var7->pending_action_queue->type + lVar26);
      _Var9 = *p_Var1;
      ts.tv_nsec = p_Var1[1];
      puVar2 = (undefined8 *)((long)&p_Var7->pending_action_queue->u + lVar26);
      local_a8.node_join.node_name = (char *)*puVar2;
      local_a8.node_join.contact_string = (char *)puVar2[1];
      ts.tv_sec._4_4_ = (int)((ulong)_Var9 >> 0x20);
      iVar12 = ts.tv_sec._4_4_;
      ts.tv_sec = _Var9;
      p_Var16 = find_stone_state(iVar12,p_Var7);
      uVar4 = p_Var16->node;
      p_Var35 = p_Var31->cm;
      pFVar24 = (FILE *)p_Var35->CMTrace_file;
      if (p_Var31->nodes[(int)uVar4].shutdown_status_contribution == -3) {
        iVar12 = CMtrace_val[0xd];
        if (pFVar24 == (FILE *)0x0) {
          iVar12 = CMtrace_init(p_Var35,EVdfgVerbose);
        }
        if (iVar12 != 0) {
          printf("Skipping action because node failed -> ");
          act._8_8_ = ts.tv_nsec;
          act.type = (undefined4)ts.tv_sec;
          act.stone_id = ts.tv_sec._4_4_;
          act.u.bridge.action = local_a8.node_join.node_name;
          act.u._8_8_ = local_a8.node_join.contact_string;
          fdump_dfg_config_action(p_Var31->cm->CMTrace_file,act);
        }
        *(undefined4 *)((long)&p_Var7->pending_action_queue->type + lVar26) = 0;
      }
      else {
        if (pFVar24 == (FILE *)0x0) {
          iVar12 = CMtrace_init(p_Var35,EVdfgVerbose);
          if (iVar12 != 0) {
            pFVar24 = (FILE *)p_Var31->cm->CMTrace_file;
            goto LAB_001451e2;
          }
        }
        else if (CMtrace_val[0xd] != 0) {
LAB_001451e2:
          fprintf(pFVar24,"Assigning action to node %d -> ",(ulong)uVar4);
          act_00._8_8_ = ts.tv_nsec;
          act_00.type = (undefined4)ts.tv_sec;
          act_00.stone_id = ts.tv_sec._4_4_;
          act_00.u.bridge.action = local_a8.node_join.node_name;
          act_00.u._8_8_ = local_a8.node_join.contact_string;
          fdump_dfg_config_action(p_Var31->cm->CMTrace_file,act_00);
        }
        *(uint *)((long)&p_Var7->pending_action_queue->node_for_action + lVar26) = uVar4;
      }
      lVar26 = lVar26 + 0x20;
    }
    add_bridge_stones(dfg,dfg->working_state);
    p_Var7 = dfg->working_state;
    for (lVar26 = 0; lVar26 < p_Var7->stone_count; lVar26 = lVar26 + 1) {
      p_Var16 = p_Var7->stones[lVar26];
      if (p_Var16->condition == EVstone_Frozen) {
        ts.tv_sec = CONCAT44(p_Var16->stone_id,0xb);
        ts.tv_nsec = CONCAT44(ts.tv_nsec._4_4_,p_Var16->node);
        act_01._8_8_ = ts.tv_nsec;
        act_01.type = 0xb;
        act_01.stone_id = p_Var16->stone_id;
        act_01.u.create.action =
             (anon_struct_8_1_4c536f74_for_create)
             (anon_struct_8_1_4c536f74_for_create)local_a8.node_join.node_name;
        act_01.u._8_8_ = local_a8.node_join.contact_string;
        EVdfg_add_act_to_queue(p_Var7,act_01);
        p_Var16->condition = EVstone_Deployed;
      }
    }
    pFVar24 = (FILE *)p_Var17->cm->CMTrace_file;
    if (pFVar24 == (FILE *)0x0) {
      iVar12 = CMtrace_init(p_Var17->cm,EVdfgVerbose);
      if (iVar12 != 0) {
        pFVar24 = (FILE *)p_Var17->cm->CMTrace_file;
        goto LAB_001452d1;
      }
    }
    else if (CMtrace_val[0xd] != 0) {
LAB_001452d1:
      fwrite("EVDFG pending actions to be done on nodes\n",0x2a,1,pFVar24);
      lVar26 = 0;
      for (lVar32 = 0; lVar32 < dfg->working_state->pending_action_count; lVar32 = lVar32 + 1) {
        p_Var8 = dfg->working_state->pending_action_queue;
        puVar2 = (undefined8 *)((long)&p_Var8->u + lVar26);
        act_02.u.bridge.action = (char *)*puVar2;
        act_02._0_16_ = *(undefined1 (*) [16])((long)&p_Var8->type + lVar26);
        act_02.u._8_8_ = puVar2[1];
        fdump_dfg_config_action(p_Var17->cm->CMTrace_file,act_02);
        lVar26 = lVar26 + 0x20;
      }
    }
    p_Var31 = dfg->master;
    for (lVar26 = (long)p_Var31->old_node_count; p_Var7 = dfg->working_state,
        lVar26 < p_Var31->node_count; lVar26 = lVar26 + 1) {
      deploy_to_node(dfg,(int)lVar26,p_Var7);
      dfg->master->nodes[lVar26].needs_ready = 1;
      p_Var7 = dfg->working_state;
      lVar32 = 0;
      for (lVar30 = 0; lVar30 < p_Var7->pending_action_count; lVar30 = lVar30 + 1) {
        p_Var1 = (__time_t *)((long)&p_Var7->pending_action_queue->type + lVar32);
        ts.tv_sec = *p_Var1;
        ts.tv_nsec = p_Var1[1];
        puVar2 = (undefined8 *)((long)&p_Var7->pending_action_queue->u + lVar32);
        uVar10 = *puVar2;
        uVar11 = puVar2[1];
        if ((int)ts.tv_nsec == (int)lVar26) {
          out = p_Var17->cm->CMTrace_file;
          if (out == (FILE *)0x0) {
            iVar12 = CMtrace_init(p_Var17->cm,EVdfgVerbose);
            if (iVar12 != 0) {
              out = p_Var17->cm->CMTrace_file;
              goto LAB_001453cf;
            }
          }
          else if (CMtrace_val[0xd] != 0) {
LAB_001453cf:
            act_03._8_8_ = ts.tv_nsec;
            act_03.type = (undefined4)ts.tv_sec;
            act_03.stone_id = ts.tv_sec._4_4_;
            act_03.u.bridge.action = (char *)uVar10;
            act_03.u._8_8_ = uVar11;
            fdump_dfg_config_action(out,act_03);
          }
          *(undefined4 *)((long)&p_Var7->pending_action_queue->type + lVar32) = 0;
        }
        lVar32 = lVar32 + 0x20;
      }
      p_Var31 = dfg->master;
    }
    p_Var35 = p_Var31->cm;
    lVar26 = 4;
    local_50 = p_Var35;
    local_38 = p_Var31;
    for (lVar32 = 0; lVar32 < p_Var7->pending_action_count; lVar32 = lVar32 + 1) {
      p_Var8 = p_Var7->pending_action_queue + lVar32;
      msg.node_id = p_Var8->type;
      EStack_e4 = p_Var8->stone_id;
      uVar10 = *(undefined8 *)&p_Var8->node_for_action;
      paVar3 = &p_Var7->pending_action_queue[lVar32].u;
      list = paVar3->period;
      pcVar21 = (&paVar3->create)[1].action;
      iVar12 = CMtrace_val[0xd];
      if (p_Var35->CMTrace_file == (FILE *)0x0) {
        iVar12 = CMtrace_init(p_Var35,EVdfgVerbose);
      }
      if (iVar12 != 0) {
        act_04._8_8_ = uVar10;
        act_04.type = (int)_msg;
        act_04.stone_id = (int)(_msg >> 0x20);
        act_04.u.period = list;
        act_04.u._8_8_ = pcVar21;
        fdump_dfg_config_action(p_Var31->cm->CMTrace_file,act_04);
      }
      iStack_e0 = (int)uVar10;
      iVar12 = p_Var31->nodes[iStack_e0].self;
      if (iVar12 == 0) {
        p_Var27 = p_Var31->nodes[iStack_e0].conn;
      }
      else {
        p_Var27 = (CMConnection)0x0;
      }
      local_d8 = list.secs;
      EStack_d4 = list.usecs;
      switch(_msg & 0xffffffff) {
      case 0:
      case 2:
      case 3:
      case 0xc:
        break;
      case 1:
      case 0xd:
        iVar12 = p_Var7->pending_action_queue[lVar32].node_for_action;
        lVar30 = (long)iVar12;
        local_48 = INT_CMlookup_format(p_Var31->cm,EVdfg_deploy_format_list);
        iVar13 = CMtrace_val[0xd];
        if (p_Var31->cm->CMTrace_file == (FILE *)0x0) {
          iVar13 = CMtrace_init(p_Var31->cm,EVdfgVerbose);
        }
        if (iVar13 != 0) {
          if (CMtrace_PID != 0) {
            pFVar24 = (FILE *)p_Var31->cm->CMTrace_file;
            _Var14 = getpid();
            pVar23 = pthread_self();
            fprintf(pFVar24,"P%lxT%lx - ",(long)_Var14,pVar23);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)p_Var31->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)p_Var31->cm->CMTrace_file,
                  "Master in deploy_msg_for_node for client %s, node %d\n",
                  p_Var31->nodes[lVar30].canonical_name);
        }
        fflush((FILE *)p_Var31->cm->CMTrace_file);
        local_70._8_8_ = (EVdfg_stone_state *)0x0;
        local_40 = lVar30 * 0x38;
        local_70._0_8_ = p_Var31->nodes[lVar30].canonical_name;
        local_70._16_8_ = INT_CMmalloc(0x40);
        lVar30 = lVar26;
        for (lVar34 = lVar32; lVar34 < p_Var7->pending_action_count; lVar34 = lVar34 + 1) {
          p_Var8 = p_Var7->pending_action_queue;
          if (p_Var8[lVar34].type < (ACT_assign_node|ACT_add_action)) {
            if (((0x1ffdU >> (p_Var8[lVar34].type & 0x1f) & 1) == 0) &&
               (p_Var16 = (EVdfg_stone_state)(p_Var8 + lVar34), p_Var16->stone_id == iVar12)) {
              iVar13 = p_Var8[lVar34].stone_id;
              for (lVar33 = 0; lVar33 < p_Var7->stone_count; lVar33 = lVar33 + 1) {
                if (p_Var7->stones[lVar33]->stone_id == iVar13) {
                  add_stone_to_deploy_msg
                            ((EVdfg_configuration)local_70,
                             (EVdfg_deploy_msg *)p_Var7->stones[lVar33],p_Var16);
                  p_Var16 = extraout_RDX;
                }
              }
              iVar5 = p_Var7->pending_action_count;
              lVar33 = lVar30;
              for (lVar25 = lVar34; p_Var31 = local_38, lVar25 < iVar5; lVar25 = lVar25 + 1) {
                if (*(int *)((long)&p_Var7->pending_action_queue->type + lVar33) == iVar13) {
                  *(undefined4 *)((long)p_Var7->pending_action_queue + lVar33 + -4) = 0;
                }
                lVar33 = lVar33 + 0x20;
              }
            }
          }
          else {
            printf("Bad action type in build_deploy_msg_for_nodes (action type %d)\n");
          }
          lVar30 = lVar30 + 0x20;
        }
        p_Var6 = p_Var31->nodes;
        if (*(int *)((long)&p_Var6->needs_ready + local_40) == 0) {
          *(undefined4 *)((long)&p_Var6->needs_ready + local_40) = 1;
          piVar20 = &p_Var31->dfg->deploy_ack_count;
          *piVar20 = *piVar20 + -1;
        }
        p_Var27 = *(CMConnection *)((long)&p_Var6->conn + local_40);
        if (p_Var27 == (CMConnection)0x0) {
          IntCManager_unlock(p_Var31->cm,
                             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                             ,0x8d6);
          dfg_deploy_handler(p_Var31->cm,(CMConnection)0x0,local_70,p_Var31->client,in_R8);
          handle_deploy_ack(p_Var31,(EVmaster_msg_ptr)&ts);
          IntCManager_lock(p_Var31->cm,
                           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                           ,0x8da);
        }
        else {
          INT_CMwrite(p_Var27,local_48,local_70);
        }
        lVar30 = 0;
        for (lVar34 = 0; lVar34 < (int)local_70._8_4_; lVar34 = lVar34 + 1) {
          free(*(void **)(local_70._16_8_ + lVar30 + 0x20));
          free(*(void **)(local_70._16_8_ + lVar30 + 8));
          free(*(void **)(local_70._16_8_ + lVar30 + 0x38));
          lVar30 = lVar30 + 0x40;
        }
        free((void *)local_70._16_8_);
        p_Var35 = local_50;
        break;
      case 4:
        if (iVar12 != 0) goto LAB_0014560b;
LAB_00145927:
        INT_REVstone_set_output(p_Var27,EStack_e4,local_d8,EStack_d4);
        break;
      case 5:
        if (iVar12 == 0) {
          INT_REVstone_add_split_target(p_Var27,EStack_e4,EStack_d4);
        }
        else {
          INT_EVstone_add_split_target(p_Var35,EStack_e4,EStack_d4);
        }
        break;
      case 6:
        if (iVar12 == 0) {
          EStack_d4 = -1;
          goto LAB_00145927;
        }
        EStack_d4 = -1;
LAB_0014560b:
        INT_EVstone_set_output(p_Var35,EStack_e4,local_d8,EStack_d4);
        break;
      case 7:
        if (iVar12 == 0) {
          INT_REVstone_remove_split_target(p_Var27,EStack_e4,EStack_d4);
        }
        else {
          INT_EVstone_remove_split_target(p_Var35,EStack_e4,EStack_d4);
        }
        break;
      case 8:
        if (iVar12 == 0) {
          INT_REVset_attr_list(p_Var27,EStack_e4,(attr_list)list);
        }
        else {
          INT_EVset_attr_list(p_Var35,EStack_e4,(attr_list)list);
        }
        break;
      case 9:
        if (iVar12 == 0) {
          INT_REVdestroy_stone(p_Var27,EStack_e4);
        }
        else {
          INT_EVdestroy_stone(p_Var35,EStack_e4);
        }
        break;
      case 10:
        if (iVar12 == 0) {
          INT_REVfreeze_stone(p_Var27,EStack_e4);
        }
        else {
          INT_EVfreeze_stone(p_Var35,EStack_e4);
        }
        break;
      case 0xb:
        if (iVar12 == 0) {
          INT_REVunfreeze_stone(p_Var27,EStack_e4);
        }
        else {
          INT_EVunfreeze_stone(p_Var35,EStack_e4);
        }
        break;
      default:
        printf("Bad action in perform_action_on_nodes %d\n");
      }
      lVar26 = lVar26 + 0x20;
    }
    free(dfg->working_state->pending_action_queue);
    dfg->working_state->pending_action_queue = (_EVdfg_config_action *)0x0;
    p_Var17 = dfg->master;
    iVar12 = p_Var17->node_count;
    master = local_58;
  }
  if ((dfg->deploy_ack_count != iVar12) && (dfg->deploy_ack_condition != -1)) {
    IntCManager_unlock(p_Var17->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                       ,0xa1a);
    CMCondition_wait(dfg->master->cm,dfg->deploy_ack_condition);
    IntCManager_lock(dfg->master->cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0xa1c);
  }
LAB_001459a7:
  master->no_deployment = 0;
  if (dfg->deployed_state != (EVdfg_configuration)0x0) {
    free_dfg_state(dfg->deployed_state);
  }
  p_Var7 = dfg->working_state;
  dfg->deployed_state = p_Var7;
  p_Var18 = (EVdfg_configuration)INT_CMmalloc(0x20);
  *(undefined8 *)p_Var18 = 0;
  p_Var18->stones = (EVdfg_stone_state *)0x0;
  *(undefined8 *)&p_Var18->pending_action_count = 0;
  p_Var18->pending_action_queue = (_EVdfg_config_action *)0x0;
  iVar12 = p_Var7->stone_count;
  p_Var18->stone_count = iVar12;
  pp_Var19 = (EVdfg_stone_state *)INT_CMmalloc((long)iVar12 << 3);
  p_Var18->stones = pp_Var19;
  for (lVar26 = 0; lVar26 < p_Var7->stone_count; lVar26 = lVar26 + 1) {
    p_Var16 = (EVdfg_stone_state)INT_CMmalloc(0x68);
    p_Var18->stones[lVar26] = p_Var16;
    p_Var16 = p_Var7->stones[lVar26];
    p_Var28 = p_Var18->stones[lVar26];
    for (lVar32 = 0xd; lVar32 != 0; lVar32 = lVar32 + -1) {
      iVar12 = p_Var16->bridge_stone;
      p_Var28->node = p_Var16->node;
      p_Var28->bridge_stone = iVar12;
      p_Var16 = (EVdfg_stone_state)((long)p_Var16 + (ulong)bVar36 * -0x10 + 8);
      p_Var28 = (EVdfg_stone_state)((long)p_Var28 + (ulong)bVar36 * -0x10 + 8);
    }
    pp_Var19 = p_Var7->stones;
    p_Var16 = pp_Var19[lVar26];
    if (p_Var16->out_links != (int *)0x0) {
      piVar20 = (int *)INT_CMmalloc((long)p_Var16->out_count << 2);
      pp_Var19 = p_Var18->stones;
      pp_Var19[lVar26]->out_links = piVar20;
      p_Var16 = pp_Var19[lVar26];
      memcpy(p_Var16->out_links,p_Var7->stones[lVar26]->out_links,(long)p_Var16->out_count << 2);
      pp_Var19 = p_Var7->stones;
      p_Var16 = pp_Var19[lVar26];
    }
    if (p_Var16->in_links != (int *)0x0) {
      piVar20 = (int *)INT_CMmalloc((long)p_Var16->in_count << 2);
      pp_Var19 = p_Var18->stones;
      pp_Var19[lVar26]->in_links = piVar20;
      p_Var16 = pp_Var19[lVar26];
      memcpy(p_Var16->in_links,p_Var7->stones[lVar26]->in_links,(long)p_Var16->in_count << 2);
      pp_Var19 = p_Var7->stones;
      p_Var16 = pp_Var19[lVar26];
    }
    if (p_Var16->action != (char *)0x0) {
      pcVar21 = strdup(p_Var16->action);
      p_Var18->stones[lVar26]->action = pcVar21;
      p_Var16 = pp_Var19[lVar26];
    }
    if (p_Var16->extra_actions != (char **)0x0) {
      ppcVar22 = (char **)INT_CMmalloc((long)p_Var16->action_count << 3);
      p_Var18->stones[lVar26]->extra_actions = ppcVar22;
      for (lVar32 = 0; p_Var16 = p_Var7->stones[lVar26], lVar32 < (long)p_Var16->action_count + -1;
          lVar32 = lVar32 + 1) {
        if (p_Var16->extra_actions[lVar32] != (char *)0x0) {
          pcVar21 = strdup(p_Var16->extra_actions[lVar32]);
          p_Var18->stones[lVar26]->extra_actions[lVar32] = pcVar21;
        }
      }
    }
    if (p_Var16->attrs != (attr_list)0x0) {
      add_ref_attr_list();
    }
  }
  dfg->working_state = p_Var18;
  format = INT_CMlookup_format(dfg->master->cm,EVdfg_ready_format_list);
  p_Var35 = dfg->master->cm;
  iVar12 = CMtrace_val[0xd];
  if (p_Var35->CMTrace_file == (FILE *)0x0) {
    iVar12 = CMtrace_init(p_Var35,EVdfgVerbose);
  }
  if (iVar12 != 0) {
    if (CMtrace_PID != 0) {
      pFVar24 = (FILE *)dfg->master->cm->CMTrace_file;
      _Var14 = getpid();
      pVar23 = pthread_self();
      fprintf(pFVar24,"P%lxT%lx - ",(long)_Var14,pVar23);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)dfg->master->cm->CMTrace_file,"Master signaling DFG %p ready for operation\n",
            dfg);
  }
  fflush((FILE *)dfg->master->cm->CMTrace_file);
  lVar26 = 0;
  uVar29 = 0;
  do {
    p_Var17 = dfg->master;
    if ((long)p_Var17->node_count <= (long)uVar29) {
      dfg->deployed_stone_count = dfg->stone_count;
      local_58->old_node_count = local_58->node_count;
      return;
    }
    p_Var6 = p_Var17->nodes;
    if (*(int *)((long)&p_Var6->needs_ready + lVar26) == 0) {
      iVar12 = CMtrace_val[0xd];
      if (p_Var17->cm->CMTrace_file == (FILE *)0x0) {
        iVar12 = CMtrace_init(p_Var17->cm,EVdfgVerbose);
      }
      if (iVar12 != 0) {
        if (CMtrace_PID != 0) {
          pFVar24 = (FILE *)dfg->master->cm->CMTrace_file;
          _Var14 = getpid();
          pVar23 = pthread_self();
          fprintf(pFVar24,"P%lxT%lx - ",(long)_Var14,pVar23);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)dfg->master->cm->CMTrace_file,
                "Master - ready not required for node %d \"%s\"\n",uVar29 & 0xffffffff,
                *(undefined8 *)((long)&dfg->master->nodes->name + lVar26));
      }
      fflush((FILE *)dfg->master->cm->CMTrace_file);
    }
    else {
      p_Var27 = *(CMConnection *)((long)&p_Var6->conn + lVar26);
      if (p_Var27 == (CMConnection)0x0) {
        if (*(int *)((long)&p_Var6->self + lVar26) == 0) {
          printf("Failure, no connection, not self, node %d\n",uVar29 & 0xffffffff);
          exit(1);
        }
        pcVar21 = 
        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
        ;
        IntCManager_unlock(p_Var17->cm,
                           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                           ,0xa39);
        _msg = CONCAT44(EStack_e4,(int)uVar29);
        p_Var35 = dfg->master->cm;
        iVar12 = CMtrace_val[0xd];
        if (p_Var35->CMTrace_file == (FILE *)0x0) {
          pcVar21 = (char *)0xd;
          iVar12 = CMtrace_init(p_Var35,EVdfgVerbose);
        }
        if (iVar12 != 0) {
          if (CMtrace_PID != 0) {
            pFVar24 = (FILE *)dfg->master->cm->CMTrace_file;
            _Var14 = getpid();
            pVar23 = pthread_self();
            fprintf(pFVar24,"P%lxT%lx - ",(long)_Var14,pVar23);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          pcVar21 = "Master DFG %p is ready, local signalling %d\n";
          fprintf((FILE *)dfg->master->cm->CMTrace_file,
                  "Master DFG %p is ready, local signalling %d\n",dfg,
                  (ulong)(uint)dfg->client->ready_condition);
        }
        fflush((FILE *)dfg->master->cm->CMTrace_file);
        dfg_ready_handler(dfg->master->cm,(CMConnection)pcVar21,&msg,dfg->client,in_R8);
        IntCManager_lock(dfg->master->cm,
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                         ,0xa3d);
      }
      else {
        _msg = CONCAT44(EStack_e4,(int)uVar29);
        INT_CMwrite(p_Var27,format,&msg);
        p_Var35 = dfg->master->cm;
        iVar12 = CMtrace_val[0xd];
        if (p_Var35->CMTrace_file == (FILE *)0x0) {
          iVar12 = CMtrace_init(p_Var35,EVdfgVerbose);
        }
        if (iVar12 != 0) {
          if (CMtrace_PID != 0) {
            pFVar24 = (FILE *)dfg->master->cm->CMTrace_file;
            _Var14 = getpid();
            pVar23 = pthread_self();
            fprintf(pFVar24,"P%lxT%lx - ",(long)_Var14,pVar23);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)dfg->master->cm->CMTrace_file,"Master - ready sent to node %d \"%s\"\n",
                  uVar29 & 0xffffffff,*(undefined8 *)((long)&dfg->master->nodes->name + lVar26));
        }
        fflush((FILE *)dfg->master->cm->CMTrace_file);
      }
      *(undefined4 *)((long)&dfg->master->nodes->needs_ready + lVar26) = 0;
    }
    uVar29 = uVar29 + 1;
    lVar26 = lVar26 + 0x38;
  } while( true );
}

Assistant:

static void
check_all_nodes_registered(EVmaster master)
{
    int i;
    EVdfg dfg = master->dfg;
    if (master->node_join_handler != NULL) {
	EVint_node_list node = &master->nodes[master->node_count-1];
	CManager_unlock(master->cm);
	(master->node_join_handler)(master, node->name, NULL, NULL);
	CManager_lock(master->cm);
	dfg = master->dfg;
	if ((dfg == NULL) || (dfg->realized == 0) || 
	    (dfg->realized == 1 && master->reconfig == 1)) return;
    } else {
	/* must be static node list */
	for(i=0; i<master->node_count; i++) {
	    if (!master->nodes[i].self && (master->nodes[i].conn == NULL)) {
		return;
	    }
	}
    }
	
    if (master->no_deployment == 0) {
	perform_deployment(dfg);
	wait_for_deploy_acks(dfg);
    }
    master->no_deployment = 0;
    if (dfg->deployed_state) {
	free_dfg_state(dfg->deployed_state);
    }
    dfg->deployed_state = dfg->working_state;
    dfg->working_state = copy_dfg_state(dfg->deployed_state);
    
    signal_ready(dfg);
    dfg->deployed_stone_count = dfg->stone_count;
    master->old_node_count = master->node_count;
}